

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O2

void __thiscall Interface::Notify(Interface *this,string *sParams)

{
  ostream *poVar1;
  char *pcVar2;
  
  pcVar2 = "info string ";
  if (this->m_Protocol == PROTOCOL_XBOARD) {
    pcVar2 = "# ";
  }
  poVar1 = std::operator<<(this->m_Out,pcVar2);
  poVar1 = std::operator<<(poVar1,(string *)sParams);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

INTERFACE_PROTOTYPE( Notify )
    {
        switch ( m_Protocol )
        {
        case PROTOCOL_XBOARD:
            ( *m_Out ) << "# " << sParams << endl;
            break;

        default:
        case PROTOCOL_UCI:
            ( *m_Out ) << "info string " << sParams << endl;
            break;
        }
    }